

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O1

ecs_table_t *
ecs_table_traverse_add
          (ecs_world_t *world,ecs_table_t *node,ecs_entities_t *to_add,ecs_entities_t *added)

{
  int iVar1;
  ulong e;
  ecs_edge_t *peVar2;
  ecs_table_t *node_00;
  long lVar3;
  ecs_table_t *node_01;
  ecs_entities_t owned;
  ecs_entity_t owned_array [32];
  ecs_entities_t local_158;
  long local_148;
  ecs_entity_t *local_140;
  ecs_entity_t local_138 [33];
  
  local_148 = (long)to_add->count;
  node_00 = &(world->store).root;
  if (node != (ecs_table_t *)0x0) {
    node_00 = node;
  }
  local_140 = to_add->array;
  local_158.array = local_138;
  local_158.count = 0;
  if (0 < local_148) {
    lVar3 = 0;
    node_01 = node_00;
    do {
      e = local_140[lVar3];
      _ecs_assert(e != 0,2,(char *)0x0,"e != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x279);
      if (e == 0) {
        __assert_fail("e != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                      ,0x279,
                      "ecs_table_t *ecs_table_traverse_add(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      peVar2 = get_edge(node_01,e);
      node_00 = peVar2->add;
      if (node_00 == (ecs_table_t *)0x0) {
        node_00 = find_or_create_table_include(world,node_01,e);
        _ecs_assert(node_00 != (ecs_table_t *)0x0,0xc,(char *)0x0,"next != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                    ,0x280);
        if (node_00 == (ecs_table_t *)0x0) {
          __assert_fail("next != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                        ,0x280,
                        "ecs_table_t *ecs_table_traverse_add(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                       );
        }
        peVar2->add = node_00;
      }
      if ((added != (ecs_entities_t *)0x0) &&
         (((e & 0xff00000000000000) == 0xfc00000000000000 || (node_01 != node_00)))) {
        iVar1 = added->count;
        added->count = iVar1 + 1;
        added->array[iVar1] = e;
      }
      if (((e & 0xff00000000000000) == 0xfe00000000000000) && (node_01 != node_00)) {
        find_owned_components
                  (world,(ecs_table_t *)(e & 0xffffffffffffff),(ecs_entity_t)&local_158,
                   (ecs_entities_t *)0xfe00000000000000);
      }
      lVar3 = lVar3 + 1;
      node_01 = node_00;
    } while (local_148 != lVar3);
  }
  if (local_158.count != 0) {
    node_00 = ecs_table_traverse_add(world,node_00,&local_158,added);
  }
  return node_00;
}

Assistant:

ecs_table_t* ecs_table_traverse_add(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entities_t * to_add,
    ecs_entities_t * added)    
{
    int32_t i, count = to_add->count;
    ecs_entity_t *entities = to_add->array;
    node = node ? node : &world->store.root;

    ecs_entity_t owned_array[ECS_MAX_ADD_REMOVE];
    ecs_entities_t owned = {
        .array = owned_array,
        .count = 0
    };    

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        /* Adding 0 to an entity is not valid */
        ecs_assert(e != 0, ECS_INVALID_PARAMETER, NULL);

        ecs_edge_t *edge = get_edge(node, e);
        ecs_table_t *next = edge->add;

        if (!next) {
            next = find_or_create_table_include(world, node, e);
            ecs_assert(next != NULL, ECS_INTERNAL_ERROR, NULL);
            edge->add = next;
        }

        bool has_case = ECS_HAS_ROLE(e, CASE);
        if (added && (node != next || has_case)) {
            added->array[added->count ++] = e; 
        }

        if ((node != next) && ECS_HAS_ROLE(e, INSTANCEOF)) {
            find_owned_components(world, next, ECS_COMPONENT_MASK & e, &owned);
        }        

        node = next;
    }

    /* In case OWNED components were found, add them as well */
    if (owned.count) {
        node = ecs_table_traverse_add(world, node, &owned, added);
    }

    return node;
}